

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HopcroftKarpAlgorithm.cpp
# Opt level: O3

bool __thiscall BoxNesting::HopcroftKarpAlgorithm::bfs(HopcroftKarpAlgorithm *this)

{
  short *__args;
  short sVar1;
  short sVar2;
  pointer psVar3;
  pointer pvVar4;
  short *psVar5;
  pointer psVar6;
  long lVar7;
  short *psVar8;
  bool bVar9;
  queue<short,_std::deque<short,_std::allocator<short>_>_> queue;
  short local_7a;
  _Deque_base<short,_std::allocator<short>_> local_78;
  
  local_78._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_cur = (short *)0x0;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_last = (short *)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_cur = (short *)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_first = (short *)0x0;
  local_78._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<short,_std::allocator<short>_>::_M_initialize_map(&local_78,0);
  local_7a = 1;
  if (0 < this->leftVerticesCount) {
    do {
      lVar7 = (long)local_7a;
      psVar3 = (this->distances).super__Vector_base<short,_std::allocator<short>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->pairsLeft).super__Vector_base<short,_std::allocator<short>_>._M_impl.
          super__Vector_impl_data._M_start[lVar7] == 0) {
        psVar3[lVar7] = 0;
        if (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_78._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<short,std::allocator<short>>::_M_push_back_aux<short_const&>
                    ((deque<short,std::allocator<short>> *)&local_78,&local_7a);
        }
        else {
          *local_78._M_impl.super__Deque_impl_data._M_finish._M_cur = local_7a;
          local_78._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_78._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
      }
      else {
        psVar3[lVar7] = 0x7fff;
      }
      local_7a = local_7a + 1;
    } while (local_7a <= this->leftVerticesCount);
  }
  *(this->distances).super__Vector_base<short,_std::allocator<short>_>._M_impl.
   super__Vector_impl_data._M_start = 0x7fff;
  if (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_78._M_impl.super__Deque_impl_data._M_start._M_cur) {
    bVar9 = false;
  }
  else {
    do {
      sVar1 = *local_78._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_78._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_78._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_78._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
        local_78._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_78._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_78._M_impl.super__Deque_impl_data._M_start._M_last =
             local_78._M_impl.super__Deque_impl_data._M_start._M_cur + 0x100;
        local_78._M_impl.super__Deque_impl_data._M_start._M_first =
             local_78._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_78._M_impl.super__Deque_impl_data._M_start._M_node =
             local_78._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_78._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_78._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      psVar8 = (this->distances).super__Vector_base<short,_std::allocator<short>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (psVar8[sVar1] < *psVar8) {
        pvVar4 = (this->graph).
                 super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        psVar5 = *(pointer *)
                  ((long)&pvVar4[sVar1].super__Vector_base<short,_std::allocator<short>_>._M_impl +
                  8);
        for (psVar8 = *(short **)
                       &pvVar4[sVar1].super__Vector_base<short,_std::allocator<short>_>._M_impl;
            psVar8 != psVar5; psVar8 = psVar8 + 1) {
          psVar3 = (this->pairsRight).super__Vector_base<short,_std::allocator<short>_>._M_impl.
                   super__Vector_impl_data._M_start;
          psVar6 = (this->distances).super__Vector_base<short,_std::allocator<short>_>._M_impl.
                   super__Vector_impl_data._M_start;
          sVar2 = psVar3[*psVar8];
          if (psVar6[sVar2] == 0x7fff) {
            __args = psVar3 + *psVar8;
            psVar6[sVar2] = psVar6[sVar1] + 1;
            if (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_78._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
              std::deque<short,std::allocator<short>>::_M_push_back_aux<short_const&>
                        ((deque<short,std::allocator<short>> *)&local_78,__args);
            }
            else {
              *local_78._M_impl.super__Deque_impl_data._M_finish._M_cur = *__args;
              local_78._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_78._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
            }
          }
        }
      }
    } while (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_78._M_impl.super__Deque_impl_data._M_start._M_cur);
    bVar9 = *(this->distances).super__Vector_base<short,_std::allocator<short>_>._M_impl.
             super__Vector_impl_data._M_start != 0x7fff;
  }
  std::_Deque_base<short,_std::allocator<short>_>::~_Deque_base(&local_78);
  return bVar9;
}

Assistant:

bool HopcroftKarpAlgorithm::bfs() const
{
	std::queue<int16_t> queue;

	// Iterate through first layer of the graph from the left
	// partition of the bipartite graph. If there is a vertex
	// that doesn't have a pair we add it to the queue
	// since we can use that vertex to traverse.
	// If it allready has a pair we set the distance to
	// to infinite because we can traverse it later from
	// left part of the graph
	for (int16_t i = 1; i <= this->leftVerticesCount; ++i) 
	{ 
		if (this->pairsLeft[i] == NILL) 
		{ 
			this->distances[i] = 0; 
			queue.push(i); 
		} 
		else
		{
			this->distances[i] = INF;
		}
	}

	// If find a shortest augmented path we end at NILL and thus
	// the distance would become the length of the path
	// We use this information to eleminate path that are not the shortest
	// since we can allready see that any path that is longer then this
	// distance is not the shortest path.
	this->distances[NILL] = INF;

	// Continue traversing through the layers
	// While nodes in the partition are unmatched
	// or have a previous match. If that is not the case
	// the next vertex is NILL and we are getting there first
	// time this run
	while (!queue.empty()) 
	{ 
		auto i = queue.front(); 
		queue.pop(); 

		if (this->distances[i] < this->distances[NILL]) 
		{ 
			for (auto j : this->graph[i])
			{
				if (this->distances[this->pairsRight[j]] == INF) 
				{ 
					this->distances[this->pairsRight[j]] = this->distances[i] + 1; 
					queue.push(this->pairsRight[j]); 
				} 
			} 
		} 
	} 

	// If we could come back to NIL using alternating path of distinct 
	// vertices that is shorter then before then distance to null must
	// be set
	return this->distances[NILL] != INF; 
}